

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mustache.cpp
# Opt level: O3

void __thiscall TestMustache::testPartialFile(TestMustache *this)

{
  QByteArrayView QVar1;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QStringView QVar5;
  QStringView QVar6;
  QVariantHash map;
  PartialFileLoader partialLoader;
  QString local_168;
  QString output;
  anon_union_24_3_e3d07ef4_for_data local_130;
  QString path;
  QtVariantContext context;
  Renderer renderer;
  
  QCoreApplication::applicationDirPath();
  QVar1.m_data = (storage_type *)0x9;
  QVar1.m_size = (qsizetype)&renderer;
  QString::fromUtf8(QVar1);
  partialLoader.super_PartialResolver._vptr_PartialResolver =
       (_func_int **)renderer.m_partialStack.super_QList<QString>.d.d;
  partialLoader.m_basePath.d.d = (Data *)renderer.m_partialStack.super_QList<QString>.d.ptr;
  partialLoader.m_basePath.d.ptr = (char16_t *)renderer.m_partialStack.super_QList<QString>.d.size;
  QVar2.m_data = (storage_type *)0x13;
  QVar2.m_size = (qsizetype)&renderer;
  QString::fromUtf8(QVar2);
  context.super_Context._vptr_Context =
       (_func_int **)renderer.m_partialStack.super_QList<QString>.d.d;
  context.super_Context.m_partialResolver =
       (PartialResolver *)renderer.m_partialStack.super_QList<QString>.d.ptr;
  context.m_contextStack.super_QList<QVariant>.d.d =
       (Data *)renderer.m_partialStack.super_QList<QString>.d.size;
  contactInfo((QString *)&map,(QString *)&partialLoader);
  if (context.super_Context._vptr_Context != (_func_int **)0x0) {
    LOCK();
    *(int *)context.super_Context._vptr_Context = *(int *)context.super_Context._vptr_Context + -1;
    UNLOCK();
    if (*(int *)context.super_Context._vptr_Context == 0) {
      QArrayData::deallocate((QArrayData *)context.super_Context._vptr_Context,2,8);
    }
  }
  if (partialLoader.super_PartialResolver._vptr_PartialResolver != (_func_int **)0x0) {
    LOCK();
    *(int *)partialLoader.super_PartialResolver._vptr_PartialResolver =
         *(int *)partialLoader.super_PartialResolver._vptr_PartialResolver + -1;
    UNLOCK();
    if (*(int *)partialLoader.super_PartialResolver._vptr_PartialResolver == 0) {
      QArrayData::deallocate
                ((QArrayData *)partialLoader.super_PartialResolver._vptr_PartialResolver,2,8);
    }
  }
  QVar3.m_data = (storage_type *)0xc;
  QVar3.m_size = (qsizetype)&renderer;
  QString::fromUtf8(QVar3);
  local_168.d.d = (Data *)renderer.m_partialStack.super_QList<QString>.d.d;
  local_168.d.ptr = (char16_t *)renderer.m_partialStack.super_QList<QString>.d.ptr;
  local_168.d.size = renderer.m_partialStack.super_QList<QString>.d.size;
  Mustache::Renderer::Renderer(&renderer);
  Mustache::PartialFileLoader::PartialFileLoader(&partialLoader,&path);
  ::QVariant::QVariant((QVariant *)&local_130,(QHash *)&map);
  Mustache::QtVariantContext::QtVariantContext
            (&context,(QVariant *)&local_130,&partialLoader.super_PartialResolver);
  ::QVariant::~QVariant((QVariant *)&local_130);
  Mustache::Renderer::render(&output,&renderer,&local_168,&context.super_Context);
  QVar4.m_data = (storage_type *)0x21;
  QVar4.m_size = (qsizetype)&local_130;
  QString::fromUtf8(QVar4);
  QVar5.m_data = output.d.ptr;
  QVar5.m_size = output.d.size;
  QVar6.m_data = (storage_type_conflict *)local_130._8_8_;
  QVar6.m_size = local_130._16_8_;
  QTest::qCompare(QVar5,QVar6,"output","QString(\"Jim Smith -- jim.smith@gmail.com\\n\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                  ,0x148);
  if ((QArrayData *)local_130.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_130.shared = *(int *)local_130.shared + -1;
    UNLOCK();
    if (*(int *)local_130.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_130.shared,2,8);
    }
  }
  if (output.d.d != (Data *)0x0) {
    LOCK();
    ((output.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((output.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((output.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(output.d.d)->super_QArrayData,2,8);
    }
  }
  context.super_Context._vptr_Context = (_func_int **)&PTR__QtVariantContext_00122c90;
  QArrayDataPointer<QVariant>::~QArrayDataPointer
            ((QArrayDataPointer<QVariant> *)&context.m_contextStack);
  partialLoader.super_PartialResolver._vptr_PartialResolver =
       (_func_int **)&PTR__PartialFileLoader_00122d10;
  QHash<QString,_QString>::~QHash(&partialLoader.m_cache);
  if (partialLoader.m_basePath.d.d != (Data *)0x0) {
    LOCK();
    ((partialLoader.m_basePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((partialLoader.m_basePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
         _M_i + -1;
    UNLOCK();
    if (((partialLoader.m_basePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(partialLoader.m_basePath.d.d)->super_QArrayData,2,8);
    }
  }
  Mustache::Renderer::~Renderer(&renderer);
  if (&(local_168.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,2,8);
    }
  }
  QHash<QString,_QVariant>::~QHash(&map);
  if (path.d.d != (Data *)0x0) {
    LOCK();
    ((path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(path.d.d)->super_QArrayData,2,8);
    }
  }
  return;
}

Assistant:

void TestMustache::testPartialFile()
{
	QString path = QCoreApplication::applicationDirPath();

	QVariantHash map = contactInfo("Jim Smith", "jim.smith@gmail.com");

	QString _template = "{{>partial}}";

	Mustache::Renderer renderer;
	Mustache::PartialFileLoader partialLoader(path);
	Mustache::QtVariantContext context(map, &partialLoader);
	QString output = renderer.render(_template, &context);

	QCOMPARE(output, QString("Jim Smith -- jim.smith@gmail.com\n"));
}